

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::logQueueInfo(CLIntercept *this,cl_device_id device,cl_command_queue queue)

{
  cl_command_queue_properties cVar1;
  cl_int cVar2;
  cl_int cVar3;
  float __x;
  float __x_00;
  float fVar4;
  float extraout_XMM0_Da;
  float __x_01;
  cl_uint queueIndex;
  cl_uint queueFamily;
  char *deviceName;
  cl_command_queue_properties props;
  string local_48;
  
  std::mutex::lock(&this->m_Mutex);
  logf(this,__x);
  deviceName = (char *)0x0;
  cVar2 = allocateAndGetDeviceInfoString(this,device,0x102b,&deviceName);
  props = 0;
  cVar3 = (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1093,8,&props,(size_t *)0x0);
  if (cVar3 == 0 && cVar2 == 0) {
    fVar4 = logf(this,__x_00);
    cVar1 = props;
    if (props != 0) {
      CEnumNameMap::name_command_queue_properties_abi_cxx11_(&local_48,&this->m_EnumNameMap,props);
      fVar4 = extraout_XMM0_Da;
    }
    logf(this,fVar4);
    if (cVar1 != 0) {
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  queueFamily = 0;
  cVar2 = (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x418c,4,&queueFamily,(size_t *)0x0);
  queueIndex = 0;
  cVar3 = (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x418d,4,&queueIndex,(size_t *)0x0);
  if (cVar3 == 0 && cVar2 == 0) {
    fVar4 = logf(this,__x_01);
    logf(this,fVar4);
  }
  if (deviceName != (char *)0x0) {
    operator_delete__(deviceName);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::logQueueInfo(
    const cl_device_id device,
    const cl_command_queue queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    logf( "Queue Info for %p:\n", queue );

    char*   deviceName = NULL;
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_NAME,
        deviceName );
    cl_command_queue_properties props = 0;
    errorCode |= dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_PROPERTIES,
        sizeof(props),
        &props,
        NULL );
    if( errorCode == CL_SUCCESS )
    {
        logf( "    For device: %s\n", deviceName );
        logf( "    Queue properties: %s\n",
            props == 0 ?
            "(None)" :
            enumName().name_command_queue_properties(props).c_str() );
    }

    // Queue family information, may not be supported for all devices.
    cl_uint queueFamily = 0;
    cl_int errorCode_qf = dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_FAMILY_INTEL,
        sizeof(queueFamily),
        &queueFamily,
        NULL );
    cl_uint queueIndex = 0;
    errorCode_qf |= dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_INDEX_INTEL,
        sizeof(queueIndex),
        &queueIndex,
        NULL );
    if( errorCode_qf == CL_SUCCESS )
    {
        logf( "    Queue family: %u\n", queueFamily );
        logf( "    Queue index: %u\n", queueIndex );
    }

    delete [] deviceName;
}